

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void prvTidyRepairDuplicateAttributes(TidyDocImpl *doc,Node *node,Bool isXml)

{
  AttVal *pAVar1;
  bool bVar2;
  Bool BVar3;
  AttVal *temp;
  AttVal *pAStack_30;
  Bool firstRedefined;
  AttVal *second;
  AttVal *first;
  Bool isXml_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  second = node->attributes;
  while (second != (AttVal *)0x0) {
    bVar2 = false;
    if ((second->asp == (Node *)0x0) && (second->php == (Node *)0x0)) {
      pAStack_30 = second->next;
      while (pAStack_30 != (AttVal *)0x0) {
        if (((pAStack_30->asp == (Node *)0x0) && (pAStack_30->php == (Node *)0x0)) &&
           (BVar3 = AttrsHaveSameName(second,pAStack_30), BVar3 != no)) {
          if ((((isXml == no) && (second != (AttVal *)0x0)) &&
              ((second->dict != (Attribute *)0x0 &&
               ((second->dict->id == TidyAttr_CLASS && ((int)(doc->config).value[0x28].v != 0))))))
             && ((second != (AttVal *)0x0 &&
                 (((second->value != (tmbstr)0x0 && (pAStack_30 != (AttVal *)0x0)) &&
                  (pAStack_30->value != (tmbstr)0x0)))))) {
            prvTidyAppendToClassAttr(doc,second,pAStack_30->value);
            pAVar1 = pAStack_30->next;
            prvTidyReportAttrError(doc,node,pAStack_30,0x24e);
            prvTidyRemoveAttribute(doc,node,pAStack_30);
            pAStack_30 = pAVar1;
          }
          else if ((((isXml == no) && (second != (AttVal *)0x0)) &&
                   (((second->dict != (Attribute *)0x0 &&
                     ((second->dict->id == TidyAttr_STYLE && ((int)(doc->config).value[0x29].v != 0)
                      ))) && (second != (AttVal *)0x0)))) &&
                  (((second->value != (tmbstr)0x0 && (pAStack_30 != (AttVal *)0x0)) &&
                   (pAStack_30->value != (tmbstr)0x0)))) {
            AppendToStyleAttr(doc,second,pAStack_30->value);
            pAVar1 = pAStack_30->next;
            prvTidyReportAttrError(doc,node,pAStack_30,0x24e);
            prvTidyRemoveAttribute(doc,node,pAStack_30);
            pAStack_30 = pAVar1;
          }
          else if ((doc->config).value[0x12].v == 1) {
            pAVar1 = second->next;
            prvTidyReportAttrError(doc,node,second,0x272);
            prvTidyRemoveAttribute(doc,node,second);
            bVar2 = true;
            pAStack_30 = pAStack_30->next;
            second = pAVar1;
          }
          else {
            pAVar1 = pAStack_30->next;
            prvTidyReportAttrError(doc,node,pAStack_30,0x272);
            prvTidyRemoveAttribute(doc,node,pAStack_30);
            pAStack_30 = pAVar1;
          }
        }
        else {
          pAStack_30 = pAStack_30->next;
        }
      }
      if (!bVar2) {
        second = second->next;
      }
    }
    else {
      second = second->next;
    }
  }
  return;
}

Assistant:

void TY_(RepairDuplicateAttributes)( TidyDocImpl* doc, Node *node, Bool isXml )
{
    AttVal *first;

    for (first = node->attributes; first != NULL;)
    {
        AttVal *second;
        Bool firstRedefined = no;

        if (!(first->asp == NULL && first->php == NULL))
        {
            first = first->next;
            continue;
        }

        for (second = first->next; second != NULL;)
        {
            AttVal *temp;

            if (!(second->asp == NULL && second->php == NULL
                  && AttrsHaveSameName(first, second)))
            {
                second = second->next;
                continue;
            }

            /* first and second attribute have same local name */
            /* now determine what to do with this duplicate... */

            if (!isXml
                && attrIsCLASS(first) && cfgBool(doc, TidyJoinClasses)
                && AttrHasValue(first) && AttrHasValue(second))
            {
                /* concatenate classes */

                TY_(AppendToClassAttr)(doc, first, second->value);

                temp = second->next;
                TY_(ReportAttrError)( doc, node, second, JOINING_ATTRIBUTE);
                TY_(RemoveAttribute)( doc, node, second );
                second = temp;
            }
            else if (!isXml
                     && attrIsSTYLE(first) && cfgBool(doc, TidyJoinStyles)
                     && AttrHasValue(first) && AttrHasValue(second))
            {
                AppendToStyleAttr( doc, first, second->value );

                temp = second->next;
                TY_(ReportAttrError)( doc, node, second, JOINING_ATTRIBUTE);
                TY_(RemoveAttribute)( doc, node, second );
                second = temp;
            }
            else if ( cfg(doc, TidyDuplicateAttrs) == TidyKeepLast )
            {
                temp = first->next;
                TY_(ReportAttrError)( doc, node, first, REPEATED_ATTRIBUTE);
                TY_(RemoveAttribute)( doc, node, first );
                firstRedefined = yes;
                first = temp;
                second = second->next;
            }
            else /* TidyDuplicateAttrs == TidyKeepFirst */
            {
                temp = second->next;
                TY_(ReportAttrError)( doc, node, second, REPEATED_ATTRIBUTE);
                TY_(RemoveAttribute)( doc, node, second );
                second = temp;
            }
        }
        if (!firstRedefined)
            first = first->next;
    }
}